

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void __thiscall QString::resize(QString *this,qsizetype size)

{
  bool bVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  QArrayDataPointer<char16_t> *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  QString *unaff_retaddr;
  AllocationOption in_stack_0000001c;
  QString *in_stack_00000020;
  qsizetype in_stack_00000058;
  QArrayDataPointer<char16_t> *newSize;
  
  if ((long)in_RSI < 0) {
    in_RSI = (QArrayDataPointer<char16_t> *)0x0;
  }
  newSize = in_RDI;
  QArrayDataPointer<char16_t>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<char16_t>::needsDetach(in_RSI);
  if ((bVar1) || (bVar1 = needsReallocate(unaff_retaddr,(qsizetype)newSize), bVar1)) {
    reallocData(in_stack_00000020,in_stack_00000058,in_stack_0000001c);
  }
  in_RDI->size = (qsizetype)in_RSI;
  QArrayDataPointer<char16_t>::operator->(in_RDI);
  qVar2 = QArrayDataPointer<char16_t>::allocatedCapacity(in_RSI);
  if (qVar2 != 0) {
    pcVar3 = QArrayDataPointer<char16_t>::data(in_RDI);
    pcVar3[(long)in_RSI] = L'\0';
  }
  return;
}

Assistant:

void QString::resize(qsizetype size)
{
    if (size < 0)
        size = 0;

    if (d->needsDetach() || needsReallocate(*this, size))
        reallocData(size, QArrayData::Grow);
    d.size = size;
    if (d->allocatedCapacity())
        d.data()[size] = u'\0';
}